

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::ValueRangeExpression>
          (SampledValueExprVisitor *this,ValueRangeExpression *expr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  bool bVar2;
  KnownSystemName KVar3;
  Symbol *pSVar4;
  Expression *in_RSI;
  ValueRangeExpression *in_RDI;
  KnownSystemName ksn;
  CallExpression *call;
  Symbol *sym;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff68;
  ExpressionKind EVar5;
  ASTContext *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  KnownSystemName in_stack_ffffffffffffff84;
  SourceLocation in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> in_stack_ffffffffffffffa0;
  
  code = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  EVar5 = in_RSI->kind;
  if (EVar5 == NamedValue) {
    pSVar4 = Expression::getSymbolReference
                       ((Expression *)
                        in_stack_ffffffffffffffa0._M_extent._M_extent_value._M_extent_value,
                        in_stack_ffffffffffffffa0._M_ptr._7_1_);
    if (pSVar4 != (Symbol *)0x0) {
      if (pSVar4->kind != LocalAssertionVar) {
        if (pSVar4->kind != AssertionPort) {
          return;
        }
        Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x9543d7);
        bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0x9543df);
        if (!bVar1) {
          return;
        }
      }
      sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff84;
      sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff80;
      sourceRange.endLoc = in_stack_ffffffffffffff88;
      ASTContext::addDiag(in_stack_ffffffffffffff78,code,sourceRange);
    }
  }
  else if (EVar5 == Call) {
    Expression::as<slang::ast::CallExpression>(in_RSI);
    bVar1 = CallExpression::isSystemCall((CallExpression *)0x954450);
    if (bVar1) {
      KVar3 = CallExpression::getKnownSystemName
                        ((CallExpression *)CONCAT44(EVar5,in_stack_ffffffffffffff68));
      bVar1 = false;
      if (KVar3 == Matched) {
        CallExpression::arguments((CallExpression *)0x95447e);
        bVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           0x954492);
        bVar1 = false;
        if (!bVar2) {
          CallExpression::arguments((CallExpression *)0x9544a9);
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     &stack0xffffffffffffffa0,0);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x9544cd);
          bVar1 = Type::isSequenceType((Type *)0x9544d5);
        }
      }
      if (bVar1 != false) {
        in_stack_ffffffffffffff88 = (in_RSI->sourceRange).startLoc;
        code = SUB84((in_RSI->sourceRange).endLoc,4);
        sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff84;
        sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff80;
        sourceRange_00.endLoc = in_stack_ffffffffffffff88;
        ASTContext::addDiag(in_stack_ffffffffffffff78,code,sourceRange_00);
      }
      if ((((ulong)(in_RDI->super_Expression).type.ptr & 1) != 0) &&
         (bVar1 = SemanticFacts::isGlobalFutureSampledValueFunc(in_stack_ffffffffffffff84), bVar1))
      {
        sourceRange_01.startLoc._4_4_ = 0x1d0008;
        sourceRange_01.startLoc._0_4_ = in_stack_ffffffffffffff80;
        sourceRange_01.endLoc = in_stack_ffffffffffffff88;
        ASTContext::addDiag((ASTContext *)(in_RSI->sourceRange).endLoc,code,sourceRange_01);
      }
    }
  }
  else {
    ValueRangeExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
              (in_RDI,(SampledValueExprVisitor *)
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        auto ksn = call.getKnownSystemName();
                        if (ksn == KnownSystemName::Matched && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && SemanticFacts::isGlobalFutureSampledValueFunc(ksn))
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }